

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

QString * QBenchmarkValgrindUtils::outFileBase(qint64 pid)

{
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  longlong in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [17];
  QByteArrayView *in_stack_ffffffffffffff90;
  QString *pQVar2;
  QChar fillChar;
  QChar local_32;
  storage_type *local_30;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QByteArrayView::QByteArrayView<17ul>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  fillChar.ucs = (char16_t)((ulong)pQVar2 >> 0x30);
  QVar1.m_data = local_30;
  QVar1.m_size = (qsizetype)local_20;
  QString::fromLatin1(QVar1);
  if (in_RSI == (QString *)0xffffffffffffffff) {
    in_RSI = (QString *)QCoreApplication::applicationPid();
  }
  QChar::QChar<char16_t,_true>(&local_32,L' ');
  QString::arg<long_long,_true>
            (in_RSI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             fillChar);
  QString::~QString((QString *)0x1ae6bd);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QBenchmarkValgrindUtils::outFileBase(qint64 pid)
{
    return QString::fromLatin1("callgrind.out.%1").arg(
        pid != -1 ? pid : QCoreApplication::applicationPid());
}